

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O2

void __thiscall aeron::BufferBuilder::BufferBuilder(BufferBuilder *this,uint32_t initialLength)

{
  uint uVar1;
  uchar *puVar2;
  
  this->_vptr_BufferBuilder = (_func_int **)&PTR__BufferBuilder_0016f230;
  uVar1 = util::BitUtil::findNextPowerOfTwo<unsigned_int>(initialLength);
  this->m_capacity = uVar1;
  this->m_limit = 0x20;
  puVar2 = (uchar *)operator_new__((ulong)uVar1);
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar2;
  return;
}

Assistant:

BufferBuilder(std::uint32_t initialLength) :
        m_capacity(BitUtil::findNextPowerOfTwo(initialLength)),
        m_limit(static_cast<std::uint32_t>(DataFrameHeader::LENGTH)),
        m_buffer(new std::uint8_t[m_capacity])
    {
    }